

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_pcm_deinterleave_s24(void **dst,void *src,ma_uint64 frameCount,ma_uint32 channels)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ma_uint32 iChannel;
  ulong uVar4;
  
  uVar2 = 2;
  for (uVar1 = 0; uVar1 < frameCount; uVar1 = uVar1 + 1) {
    uVar3 = uVar2;
    for (uVar4 = 0; channels != uVar4; uVar4 = uVar4 + 1) {
      *(undefined1 *)((long)dst[uVar4] + (ulong)(uVar1 * 3)) =
           *(undefined1 *)((long)src + (ulong)(uVar3 - 2));
      *(undefined1 *)((long)dst[uVar4] + (ulong)(uVar1 * 3 + 1)) =
           *(undefined1 *)((long)src + (ulong)(uVar3 - 1));
      *(undefined1 *)((long)dst[uVar4] + (ulong)(uVar1 * 3 + 2)) =
           *(undefined1 *)((long)src + (ulong)uVar3);
      uVar3 = uVar3 + 3;
    }
    uVar2 = uVar2 + channels * 3;
  }
  return;
}

Assistant:

MA_API void ma_pcm_deinterleave_s24(void** dst, const void* src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_deinterleave_s24__reference(dst, src, frameCount, channels);
#else
    ma_pcm_deinterleave_s24__optimized(dst, src, frameCount, channels);
#endif
}